

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O2

void __thiscall QDBusPlatformMenuItem::QDBusPlatformMenuItem(QDBusPlatformMenuItem *this)

{
  int iVar1;
  long in_FS_OFFSET;
  QDBusPlatformMenuItem *local_20;
  int local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformMenuItem::QPlatformMenuItem((QPlatformMenuItem *)this);
  *(undefined ***)this = &PTR_metaObject_0078d418;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  QIcon::QIcon((QIcon *)(this + 0x30));
  *(undefined8 *)(this + 0x38) = 0;
  iVar1 = nextDBusID * 0x10000;
  nextDBusID = nextDBusID + 1;
  *(uint *)(this + 0x40) = iVar1 + (*(uint *)(this + 0x40) & 0xfc00) + 0x30;
  QKeySequence::QKeySequence((QKeySequence *)(this + 0x48));
  local_14 = (int)*(short *)(this + 0x42);
  local_20 = (QDBusPlatformMenuItem *)this;
  QHash<int,QDBusPlatformMenuItem*>::emplace<QDBusPlatformMenuItem*const&>
            ((QHash<int,QDBusPlatformMenuItem*> *)&menuItemsByID,&local_14,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDBusPlatformMenuItem::QDBusPlatformMenuItem()
    : m_subMenu(nullptr)
    , m_role(NoRole)
    , m_isEnabled(true)
    , m_isVisible(true)
    , m_isSeparator(false)
    , m_isCheckable(false)
    , m_isChecked(false)
    , m_hasExclusiveGroup(false)
    , m_dbusID(nextDBusID++)
{
    menuItemsByID.insert(m_dbusID, this);
}